

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68000_andi_16(m68k_info *info)

{
  uint imm;
  ulong uVar1;
  
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  imm = 0xaaaa;
  if (uVar1 + 2 <= info->code_len) {
    imm = (uint)(ushort)(*(ushort *)(info->code + uVar1) << 8 | *(ushort *)(info->code + uVar1) >> 8
                        );
  }
  info->pc = info->pc + 2;
  build_imm_ea(info,8,'\x02',imm);
  return;
}

Assistant:

static void d68000_andi_16(m68k_info *info)
{
	build_imm_ea(info, M68K_INS_ANDI, 2, read_imm_16(info));
}